

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-oid.c
# Opt level: O0

void test_bson_oid_copy(void)

{
  byte bVar1;
  undefined1 local_20 [8];
  bson_oid_t oid2;
  bson_oid_t oid;
  
  bson_oid_init_from_string(oid2.bytes + 4,"000000000000000000001234");
  bson_oid_init_from_string(local_20,"000000000000000000004321");
  bson_oid_copy(oid2.bytes + 4,local_20);
  bVar1 = bson_oid_equal(oid2.bytes + 4,local_20);
  if ((bVar1 & 1) != 1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-oid.c",
            0xb1,"test_bson_oid_copy","true == bson_oid_equal (&oid, &oid2)");
    abort();
  }
  return;
}

Assistant:

static void
test_bson_oid_copy (void)
{
   bson_oid_t oid;
   bson_oid_t oid2;

   bson_oid_init_from_string (&oid, "000000000000000000001234");
   bson_oid_init_from_string (&oid2, "000000000000000000004321");
   bson_oid_copy (&oid, &oid2);
   BSON_ASSERT (true == bson_oid_equal (&oid, &oid2));
}